

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O2

char * Mips_reg_name(csh handle,uint reg)

{
  if (0x88 < reg) {
    return (char *)0x0;
  }
  return reg_name_maps[reg].name;
}

Assistant:

const char *Mips_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	if (reg >= ARR_SIZE(reg_name_maps))
		return NULL;

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}